

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cpp
# Opt level: O0

void __thiscall acto::core::worker_t::assign(worker_t *this,object_t *obj,duration slice)

{
  rep rVar1;
  runtime_t *this_00;
  object_t *obj_local;
  worker_t *this_local;
  duration slice_local;
  
  if (this->object_ != (object_t *)0x0 || obj == (object_t *)0x0) {
    __assert_fail("!object_ && obj",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/src/worker.cpp"
                  ,0x1c,
                  "void acto::core::worker_t::assign(object_t *const, const std::chrono::steady_clock::duration)"
                 );
  }
  this->object_ = obj;
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->start_).__d.__r = rVar1;
  (this->time_slice_).__r = slice.__r;
  this_00 = runtime_t::instance();
  runtime_t::acquire(this_00,obj);
  event::signaled(&this->wakeup_event_);
  return;
}

Assistant:

void worker_t::assign(object_t* const obj,
                      const std::chrono::steady_clock::duration slice) {
  assert(!object_ && obj);

  object_ = obj;
  start_ = std::chrono::steady_clock::now();
  time_slice_ = slice;
  // Acquire the object.
  runtime_t::instance()->acquire(obj);
  // Wakeup the thread.
  wakeup_event_.signaled();
}